

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0>::
find_range_fill<std::unordered_map<unsigned_long,std::optional<std::__cxx11::string>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::optional<std::__cxx11::string>>>>>
          (utlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0> *this,
          unordered_map<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *key_optional_value_range,peek peek)

{
  time_point now;
  __node_base *p_Var1;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  p_Var1 = &(key_optional_value_range->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
    ::do_find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&_Stack_58,
              (utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
               *)this,(unsigned_long *)(p_Var1 + 1),now,peek);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(p_Var1 + 2),&_Stack_58);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&_Stack_58);
  }
  return;
}

Assistant:

auto find_range_fill(range_type& key_optional_value_range, peek peek = peek::no) -> void
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};

        for (auto& [key, optional_value] : key_optional_value_range)
        {
            optional_value = do_find(key, now, peek);
        }
    }